

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O3

FT_UInt pfr_cmap_char_index(PFR_CMap cmap,FT_UInt32 char_code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = cmap->num_chars;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      uVar2 = (uVar4 - uVar3 >> 1) + uVar3;
      uVar1 = cmap->chars[uVar2].char_code;
      if (uVar1 == char_code) {
        return uVar2 + 1;
      }
      if (uVar1 < char_code) {
        uVar3 = uVar2 + 1;
        uVar2 = uVar4;
      }
      uVar4 = uVar2;
    } while (uVar3 < uVar4);
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  pfr_cmap_char_index( PFR_CMap   cmap,
                       FT_UInt32  char_code )
  {
    FT_UInt  min = 0;
    FT_UInt  max = cmap->num_chars;


    while ( min < max )
    {
      PFR_Char  gchar;
      FT_UInt   mid;


      mid   = min + ( max - min ) / 2;
      gchar = cmap->chars + mid;

      if ( gchar->char_code == char_code )
        return mid + 1;

      if ( gchar->char_code < char_code )
        min = mid + 1;
      else
        max = mid;
    }
    return 0;
  }